

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O0

void ncnn::convolution_transform_kernel_packed_int8_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int in_stack_000008f8;
  int in_stack_000008fc;
  int in_stack_00000900;
  int in_stack_00000904;
  Mat *in_stack_00000908;
  Mat *in_stack_00000910;
  
  convolution_transform_kernel_packed_int8
            (in_stack_00000910,in_stack_00000908,in_stack_00000904,in_stack_00000900,
             in_stack_000008fc,in_stack_000008f8);
  return;
}

Assistant:

void convolution_transform_kernel_packed_int8_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    convolution_transform_kernel_packed_int8(kernel, kernel_tm, inch, outch, kernel_w, kernel_h);
}